

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofConstraint::setLinearLimits
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  btVector3 *pbVar4;
  btVector3 *pbVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  btVector3 *pbVar10;
  btVector3 *pbVar11;
  int i;
  long lVar12;
  btVector3 *pbVar13;
  bool bVar14;
  btRotationalLimitMotor local_80;
  btVector3 axis;
  
  local_80.m_accumulatedImpulse = 0.0;
  pbVar10 = &(this->m_linearLimits).m_normalCFM;
  pbVar11 = &(this->m_linearLimits).m_stopCFM;
  pbVar13 = &(this->m_linearLimits).m_stopERP;
  bVar9 = 0;
  lVar12 = 0;
  do {
    local_80.m_currentLimit = (this->m_linearLimits).m_currentLimit[lVar12];
    local_80.m_enableMotor = (this->m_linearLimits).m_enableMotor[lVar12];
    if ((local_80.m_currentLimit != 0) ||
       (bVar14 = local_80.m_enableMotor != false, local_80.m_enableMotor = true, bVar14)) {
      local_80.m_bounce = 0.0;
      local_80.m_currentPosition = (this->m_linearLimits).m_currentLinearDiff.m_floats[lVar12];
      local_80.m_currentLimitError = (this->m_linearLimits).m_currentLimitError.m_floats[lVar12];
      local_80.m_hiLimit = (this->m_linearLimits).m_upperLimit.m_floats[lVar12];
      uVar1 = (this->m_linearLimits).m_limitSoftness;
      uVar2 = (this->m_linearLimits).m_damping;
      local_80.m_limitSoftness = (btScalar)uVar1;
      local_80.m_damping = (btScalar)uVar2;
      local_80.m_loLimit = (this->m_linearLimits).m_lowerLimit.m_floats[lVar12];
      local_80.m_maxLimitForce = 0.0;
      local_80.m_maxMotorForce = (this->m_linearLimits).m_maxMotorForce.m_floats[lVar12];
      local_80.m_targetVelocity = (this->m_linearLimits).m_targetVelocity.m_floats[lVar12];
      axis.m_floats[1] = (&(this->m_calculatedTransformA).m_origin)[-2].m_floats[lVar12];
      axis.m_floats[0] = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[lVar12];
      axis.m_floats[2] = (&(this->m_calculatedTransformA).m_origin)[-1].m_floats[lVar12];
      axis.m_floats[3] = 0.0;
      uVar8 = this->m_flags >> (bVar9 & 0x1f);
      pbVar4 = pbVar10;
      if ((uVar8 & 1) == 0) {
        pbVar4 = (btVector3 *)info->cfm;
      }
      pbVar5 = pbVar11;
      if ((uVar8 & 2) == 0) {
        pbVar5 = (btVector3 *)info->cfm;
      }
      local_80.m_stopCFM = pbVar5->m_floats[0];
      pbVar5 = pbVar13;
      if ((uVar8 & 4) == 0) {
        pbVar5 = (btVector3 *)&info->erp;
      }
      local_80.m_stopERP = pbVar5->m_floats[0];
      local_80.m_normalCFM = pbVar4->m_floats[0];
      uVar8 = 0;
      if (this->m_useOffsetForConstraintFrame == true) {
        lVar6 = 0;
        if (lVar12 != 2) {
          lVar6 = lVar12 + 1;
        }
        if (this->m_angularLimits[lVar6].m_currentLimit == 0) {
          uVar8 = 1;
        }
        else {
          uVar7 = (ulong)((int)lVar12 - 1);
          if (lVar12 == 0) {
            uVar7 = 2;
          }
          uVar8 = (uint)(this->m_angularLimits[uVar7].m_currentLimit == 0);
        }
      }
      iVar3 = get_limit_motor_info2
                        (this,&local_80,transA,transB,linVelA,linVelB,angVelA,angVelB,info,row,&axis
                         ,0,uVar8);
      row = iVar3 + row;
    }
    lVar12 = lVar12 + 1;
    bVar9 = bVar9 + 3;
    pbVar13 = (btVector3 *)(pbVar13->m_floats + 1);
    pbVar11 = (btVector3 *)(pbVar11->m_floats + 1);
    pbVar10 = (btVector3 *)(pbVar10->m_floats + 1);
  } while (lVar12 != 3);
  return row;
}

Assistant:

int btGeneric6DofConstraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
//	int row = 0;
	//solve linear limits
	btRotationalLimitMotor limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.needApplyForce(i))
		{ // re-use rotational motor code
			limot.m_bounce = btScalar(0.f);
			limot.m_currentLimit = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError  = m_linearLimits.m_currentLimitError[i];
			limot.m_damping  = m_linearLimits.m_damping;
			limot.m_enableMotor  = m_linearLimits.m_enableMotor[i];
			limot.m_hiLimit  = m_linearLimits.m_upperLimit[i];
			limot.m_limitSoftness  = m_linearLimits.m_limitSoftness;
			limot.m_loLimit  = m_linearLimits.m_lowerLimit[i];
			limot.m_maxLimitForce  = btScalar(0.f);
			limot.m_maxMotorForce  = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity  = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT);
			limot.m_normalCFM	= (flags & BT_6DOF_FLAGS_CFM_NORM) ? m_linearLimits.m_normalCFM[i] : info->cfm[0];
			limot.m_stopCFM		= (flags & BT_6DOF_FLAGS_CFM_STOP) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP		= (flags & BT_6DOF_FLAGS_ERP_STOP) ? m_linearLimits.m_stopERP[i] : info->erp;
			if(m_useOffsetForConstraintFrame)
			{
				int indx1 = (i + 1) % 3;
				int indx2 = (i + 2) % 3;
				int rotAllowed = 1; // rotations around orthos to current axis
				if(m_angularLimits[indx1].m_currentLimit && m_angularLimits[indx2].m_currentLimit)
				{
					rotAllowed = 0;
				}
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);
			}
			else
			{
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0);
			}
		}
	}
	return row;
}